

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Vector<int,_2>_>::genFixeds
          (DefaultSampling<tcu::Vector<int,_2>_> *this,FloatFormat *fmt,
          vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *dst)

{
  int iVar1;
  int i;
  long lVar2;
  ulong uVar3;
  vector<int,_std::allocator<int>_> scalars;
  vector<int,_std::allocator<int>_> local_38;
  Vector<int,_2> local_20;
  
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<int>::genFixeds
            ((DefaultSampling<int> *)
             &instance<vkt::shaderexecutor::DefaultSampling<int>>()::s_instance,fmt,&local_38);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    do {
      iVar1 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar3];
      lVar2 = 0;
      do {
        local_20.m_data[lVar2] = iVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 == 1);
      std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
      emplace_back<tcu::Vector<int,2>>
                ((vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)dst,&local_20);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));
	}